

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int re_parse_expect(REParseState *s,uint8_t **pp,int c)

{
  uint in_EDX;
  undefined8 *in_RSI;
  REParseState *in_RDI;
  uint8_t *p;
  int local_4;
  
  if (*(byte *)*in_RSI == in_EDX) {
    *in_RSI = (byte *)*in_RSI + 1;
    local_4 = 0;
  }
  else {
    local_4 = re_parse_error(in_RDI,"expecting \'%c\'",(ulong)in_EDX);
  }
  return local_4;
}

Assistant:

static int re_parse_expect(REParseState *s, const uint8_t **pp, int c)
{
    const uint8_t *p;
    p = *pp;
    if (*p != c)
        return re_parse_error(s, "expecting '%c'", c);
    p++;
    *pp = p;
    return 0;
}